

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_RadiusThrust
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  ActorFlags2 *pAVar1;
  uint uVar2;
  AActor *bombspot;
  int bombdistance;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  VMValue *pVVar6;
  VMValue *pVVar7;
  VMValue *pVVar8;
  int bombdamage;
  AActor *pAVar9;
  char *pcVar10;
  bool bVar11;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
LAB_003c9526:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x530,
                  "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003c9526;
  }
  bombspot = (AActor *)(param->field_0).field_1.a;
  if (bombspot != (AActor *)0x0) {
    if ((bombspot->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(bombspot->super_DThinker).super_DObject._vptr_DObject)(bombspot);
      (bombspot->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar5 = (bombspot->super_DThinker).super_DObject.Class;
    bVar11 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar11) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar11 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar11) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003c9526;
    }
  }
  if (numparam == 1) {
    pVVar6 = defaultparam->Array;
    if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003c9545:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x531,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    pVVar6 = param;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003c9545;
    }
  }
  if (numparam < 3) {
    pVVar7 = defaultparam->Array;
    if (pVVar7[2].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003c9564;
    }
  }
  else {
    pVVar7 = param;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003c9564:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x532,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  if (numparam < 4) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[3].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003c9583;
    }
  }
  else {
    pVVar8 = param;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003c9583:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x533,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  uVar2 = pVVar8[3].field_0.i;
  if (numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003c95a2;
    }
  }
  else if (param[4].field_0.field_3.Type != '\0') {
    pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003c95a2:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x534,
                  "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar4 = param[4].field_0.i;
  bombdamage = 0x80;
  if (pVVar6[1].field_0.i != 0) {
    bombdamage = pVVar6[1].field_0.i;
  }
  bombdistance = -bombdamage;
  if (0 < bombdamage) {
    bombdistance = bombdamage;
  }
  if (0 < pVVar7[2].field_0.i) {
    bombdistance = pVVar7[2].field_0.i;
  }
  if (((uVar2 & 4) == 0) && (pAVar9 = (bombspot->target).field_0.p, pAVar9 != (AActor *)0x0)) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (((((bombspot->target).field_0.p)->flags2).Value & 0x20000) != 0) {
        pAVar1 = &((bombspot->target).field_0.p)->flags2;
        pAVar1->Value = pAVar1->Value & 0xfffdffff;
        bVar11 = true;
        goto LAB_003c949e;
      }
    }
    else {
      (bombspot->target).field_0.p = (AActor *)0x0;
    }
  }
  bVar11 = false;
LAB_003c949e:
  pAVar9 = (bombspot->target).field_0.p;
  if ((pAVar9 != (AActor *)0x0) &&
     (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (bombspot->target).field_0.p = (AActor *)0x0;
    pAVar9 = (AActor *)0x0;
  }
  local_2c.Index = (bombspot->DamageType).super_FName.Index;
  P_RadiusAttack(bombspot,pAVar9,bombdamage,bombdistance,&local_2c,uVar2 | 8,iVar4);
  P_CheckSplash(bombspot,(double)bombdistance);
  if (bVar11) {
    pAVar1 = &((bombspot->target).field_0.p)->flags2;
    pAVar1->Value = pAVar1->Value | 0x20000;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RadiusThrust)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(force);
	PARAM_INT_DEF	(distance);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(fullthrustdistance);

	bool sourcenothrust = false;

	if (force == 0) force = 128;
	if (distance <= 0) distance = abs(force);

	// Temporarily negate MF2_NODMGTHRUST on the shooter, since it renders this function useless.
	if (!(flags & RTF_NOTMISSILE) && self->target != NULL && self->target->flags2 & MF2_NODMGTHRUST)
	{
		sourcenothrust = true;
		self->target->flags2 &= ~MF2_NODMGTHRUST;
	}

	P_RadiusAttack (self, self->target, force, distance, self->DamageType, flags | RADF_NODAMAGE, fullthrustdistance);
	P_CheckSplash(self, distance);

	if (sourcenothrust)
	{
		self->target->flags2 |= MF2_NODMGTHRUST;
	}
	return 0;
}